

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

Vector3d * __thiscall
Util::EGM96Grav::GetGravAccel
          (Vector3d *__return_storage_ptr__,EGM96Grav *this,Vector3d *pos,double JD_UTC)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  RealScalar __x;
  double dVar7;
  double __x_00;
  double dVar8;
  double dVar9;
  double dVar10;
  type tVar11;
  double dVar12;
  type tVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int l;
  int m;
  double dVar20;
  double dVar21;
  double dVar22;
  double __y;
  double dVar23;
  initializer_list<int> __l;
  double local_2d8;
  double local_2a0;
  _Vector_base<int,_std::allocator<int>_> local_1d8;
  Vector3d local_1c0;
  vector<int,_std::allocator<int>_> order;
  Vector3d pos_ecef;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  Vector3d accel;
  Matrix3d *local_100;
  Matrix3d *local_f8;
  Vector3d *local_f0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_e8;
  Matrix3d Rsp2cart;
  Vector3d accel_central;
  Matrix3d R_ecef2eci;
  
  __x = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)pos);
  dVar7 = pow(__x,3.0);
  dVar1 = this->mu_;
  dVar2 = this->Rearth_;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = 1.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = 1.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  R_ecef2eci.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 1.0;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector(&matvec,4,&R_ecef2eci,(allocator_type *)&Rsp2cart);
  ECEF2ECI(&R_ecef2eci,JD_UTC,this->nut80ptr_,this->iau1980ptr_,&matvec);
  Rsp2cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&R_ecef2eci;
  Rsp2cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)pos;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pos_ecef,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&Rsp2cart);
  __x_00 = asin(pos_ecef.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] / __x);
  dVar8 = atan2(pos_ecef.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1],
                pos_ecef.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0]);
  dVar21 = 0.0;
  dVar22 = 0.0;
  local_2a0 = 0.0;
  dVar23 = 2.0;
  while (__y = dVar23, __y < 21.0) {
    dVar23 = __y + 1.0;
    l = (int)__y;
    for (local_2d8 = 0.0; local_2d8 < dVar23; local_2d8 = local_2d8 + 1.0) {
      dVar9 = pow(dVar2 / __x,__y);
      m = (int)local_2d8;
      dVar3 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[(this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * (long)m + (long)l];
      dVar4 = (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[(this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * (long)m + (long)l];
      dVar20 = pow(-1.0,local_2d8);
      dVar10 = sin(__x_00);
      tVar11 = boost::math::legendre_p<double>(l,m,dVar10);
      dVar10 = pow(-1.0,local_2d8);
      dVar12 = sin(__x_00);
      tVar13 = boost::math::legendre_p<double>(l + -1,m,dVar12);
      dVar20 = dVar20 * tVar11;
      dVar12 = dVar8 * local_2d8;
      dVar14 = cos(dVar12);
      dVar15 = sin(dVar12);
      local_2a0 = local_2a0 + (dVar14 * dVar3 + dVar15 * dVar4) * dVar23 * dVar9 * dVar20;
      dVar14 = sin(__x_00);
      dVar15 = cos(__x_00);
      dVar16 = cos(__x_00);
      dVar17 = cos(dVar12);
      dVar18 = sin(dVar12);
      dVar19 = cos(dVar12);
      dVar12 = sin(dVar12);
      dVar21 = dVar21 + (dVar19 * dVar4 + -dVar3 * dVar12) * dVar20 * dVar9 * local_2d8;
      dVar22 = dVar22 + (dVar17 * dVar3 + dVar18 * dVar4) *
                        ((1.0 / dVar15) * dVar14 * -__y * dVar20 +
                        (1.0 / dVar16) * (__y + local_2d8) * dVar10 * tVar13) * dVar9;
    }
  }
  dVar23 = __x * __x;
  auVar5._8_4_ = SUB84(dVar22 * dVar1,0);
  auVar5._0_8_ = (dVar1 * dVar21) / dVar23;
  auVar5._12_4_ = (int)((ulong)(dVar22 * dVar1) >> 0x20);
  dVar2 = cos(__x_00);
  accel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (-dVar1 / dVar23) * local_2a0;
  auVar6._8_4_ = SUB84(dVar23,0);
  auVar6._0_8_ = dVar2;
  auVar6._12_4_ = (int)((ulong)dVar23 >> 0x20);
  accel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._8_16_ =
       divpd(auVar5,auVar6);
  Rsp2cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       6.36598737388395e-314;
  Rsp2cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)CONCAT44(Rsp2cart.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1]._4_4_,1);
  __l._M_len = 3;
  __l._M_array = (iterator)&Rsp2cart;
  std::vector<int,_std::allocator<int>_>::vector(&order,__l,(allocator_type *)&local_100);
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -dVar8;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       __x_00;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1d8,&order);
  Angle2RotM(&Rsp2cart,&local_1c0,(vector<int,_std::allocator<int>_> *)&local_1d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d8);
  local_f0 = (Vector3d *)(-dVar1 / dVar7);
  local_e8 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)pos;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&accel_central,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_100);
  local_f0 = &accel;
  local_100 = &R_ecef2eci;
  local_f8 = &Rsp2cart;
  local_e8 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&accel_central;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_100);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&order.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&matvec.
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d EGM96Grav::GetGravAccel(Eigen::Vector3d pos, double JD_UTC){

		//make short namespace
		namespace bm = boost::math;

		//initialize output
		Eigen::Vector3d accel;

		//locals
		double r = pos.norm();
		double r2 = pow(r,2.0);
		double r3 = pow(r,3.0);
		double R = this->Rearth_;
		double mu = this->mu_;
		double pUpr = 0.0; //partial potential wrt radius
		double pUpphi = 0.0; //partial potential wrt satellite latitude
		double pUplamb = 0.0; //partial potential wrt satellite latitude
		double nr_ij = sqrt(pow(pos[0],2.0) + pow(pos[1],2.0));

		//matrix rotating from ECEF2ECI
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = ECEF2ECI(JD_UTC, this->nut80ptr_, this->iau1980ptr_, &matvec);

		//ecef position
		Eigen::Vector3d pos_ecef = R_ecef2eci.transpose()*pos;

		// std::cout << "pos_ecef: \n" << pos_ecef << "\n";

		//lat and long
		double phi = asin(pos_ecef[2]/r);
		double lamb = atan2(pos_ecef[1],pos_ecef[0]);

		// std::cout << " JD_UTC: " << JD_UTC << " r: " << r << " phi: " << phi << " lamb: " << lamb << "\n";

		//fixed order gravity model but have capability to do more
		for (double ll = 2; ll < 21; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

		// for (double ll = 2; ll < 3; ++ll) {

		// 	for (double mm = 0; mm < 1; ++mm) {

				//locals
				double powR = pow(R/r,ll);
				double C = this->C_( (int) ll, (int) mm);
				double S = this->S_( (int) ll, (int) mm);
				double Plm = pow(-1.0,mm)*bm::legendre_p( (int) ll, (int) mm, sin(phi)); //pow(-1,m) to account for cordon shortley
				// double Plm_plus = pow(-1.0,mm+1.0)*bm::legendre_p( (int) ll, ((int) mm) + 1, sin(phi));
				double Plm_plus = pow(-1.0,mm)*bm::legendre_p( (int) ll - 1, (int) mm, sin(phi));

				// std::cout << "l: " << ll << " m: " << mm << "\n";

				pUpr += powR*(ll + 1.0)*Plm*(C*cos(mm*lamb) + S*sin(mm*lamb));
				// pUpphi += powR*(Plm_plus - mm*tan(phi)*Plm) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUpphi += powR*(-ll*sin(phi)*(1/cos(phi))*Plm + (ll+mm)*(1/cos(phi))*Plm_plus) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUplamb += powR*mm*Plm*(S*cos(mm*lamb) - C*sin(mm*lamb));

			}

		}

		//additional factors outside of sum for partials
		// pUpr = pUpr*(-mu/pow(r,2.0));
		// pUpphi = pUpphi*mu/r;
		// pUplamb = pUplamb*mu/r;
		pUpr = pUpr*(-mu/pow(r,2.0));
		pUpphi = pUpphi*mu/pow(r,2.0);
		pUplamb = pUplamb*mu/pow(r,2.0)/cos(phi);

		// pUpphi = -7.0036240305764034*pow(10.0,-8.0);

		// std::cout << "pUpr: " << pUpr << "\n" << "pUpphi: " << pUpphi << "\n" << "pUplamb: " << pUplamb << "\n";

		//calculate components of acceleration
		// accel[0] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[0] - pUplamb*pos[1]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[0]/r3;
		// accel[1] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[1] + pUplamb*pos[0]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[1]/r3;
		// accel[2] = pUpr*pos[2]/r + nr_ij*pUpphi/r2 - mu*pos[2]/r3;
		accel[0] = pUpr;
		accel[1] = pUplamb;
		accel[2] = pUpphi;

		//rotation from spherical to cartesian
		Eigen::Vector3d angles = {phi, -lamb, 0.0};
		std::vector<int> order = {2,3,1};
		Eigen::Matrix3d Rsp2cart = Angle2RotM(angles, order);

		//we also need the central acceleration in ECI
		Eigen::Vector3d accel_central = -(mu/r3)*pos;

		//rotate accel into ECI
		Eigen::Vector3d accel_eci = R_ecef2eci*Rsp2cart*accel + accel_central;

		// std::cout << "\n" << "accel ecef (no central): \n" << Rsp2cart*accel;
		// std::cout << "\n" << "accel eci (with central): \n" << accel_eci;

		// exit(0);

		return accel_eci;

	}